

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O2

void __thiscall SimpleLoggerMgr::sleepFlusher(SimpleLoggerMgr *this,size_t ms)

{
  unique_lock<std::mutex> l;
  unique_lock<std::mutex> local_30;
  duration<long,_std::ratio<1L,_1000L>_> local_20;
  
  std::unique_lock<std::mutex>::unique_lock(&local_30,&this->cvFlusherLock);
  local_20.__r = ms;
  std::condition_variable::wait_for<long,std::ratio<1l,1000l>>(&this->cvFlusher,&local_30,&local_20)
  ;
  std::unique_lock<std::mutex>::~unique_lock(&local_30);
  return;
}

Assistant:

void SimpleLoggerMgr::sleepFlusher(size_t ms) {
    std::unique_lock<std::mutex> l(cvFlusherLock);
    cvFlusher.wait_for(l, std::chrono::milliseconds(ms));
}